

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,StringTree *params_2,ArrayPtr<const_char> *params_3)

{
  long lVar1;
  long lVar2;
  long lVar3;
  size_t size;
  char *target;
  long local_48 [2];
  char *local_38;
  char *local_30;
  
  local_48[0] = *(long *)(this + 8);
  local_48[1] = params->size_;
  local_38 = params_1->ptr;
  local_30 = (params_2->text).content.ptr;
  size = 0;
  lVar2 = 0;
  do {
    size = size + *(long *)((long)local_48 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  lVar2 = *(long *)(this + 8);
  if (lVar2 != 0) {
    lVar1 = *(long *)this;
    lVar3 = 0;
    do {
      target[lVar3] = *(char *)(lVar1 + lVar3);
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
    target = target + lVar3;
  }
  fill<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (target,params,(StringTree *)params_1,(ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}